

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

ptls_private_key_result_t
sign_finish(ptls_sign_certificate_t *do_sign,ptls_t *tls,uint16_t *selected_algorithm,
           ptls_buffer_t *output)

{
  int iVar1;
  ptls_private_key_result_t pVar2;
  ptls_iovec_t pVar3;
  
  if (retry_count < 2) {
    pVar2 = ptls_private_key_retry;
    retry_count = retry_count + 1;
  }
  else {
    pVar3.len = in.len;
    pVar3.base = in.base;
    retry_count = retry_count + 1;
    iVar1 = (*do_sign->cb)(do_sign,tls,selected_algorithm,output,pVar3,algos,num_algos);
    free(in.base);
    free(algos);
    pVar2 = (uint)(iVar1 != 0) * 2;
  }
  return pVar2;
}

Assistant:

enum ptls_private_key_result_t sign_finish(ptls_sign_certificate_t *do_sign,
                                           ptls_t *tls,
                                           uint16_t *selected_algorithm,
                                           ptls_buffer_t *output)
{
    msg("sign_finish");
    ++retry_count;
    if (retry_count <= 2)
    {
        msg("retry again");
        return ptls_private_key_retry;
    }
    int rc = do_sign->cb(do_sign, tls, selected_algorithm, output, in, algos,
                         num_algos);
    free(in.base);
    free(algos);
    msg("sign_finish ret: %d", rc);
    if (rc == 0)
        return ptls_private_key_success;
    return ptls_private_key_failure;
}